

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

bool __thiscall Diligent::DeviceObjectArchive::Deserialize(DeviceObjectArchive *this,CreateInfo *CI)

{
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *this_00;
  Uint32 UVar1;
  IDataBlob *pObj;
  pointer pSVar2;
  TEnable<unsigned_int> TVar3;
  TEnableStr<const_char_*> TVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *Data;
  char (*Args_1) [16];
  char (*in_R8) [3];
  uint *in_R9;
  uint uVar8;
  SerializedData *Shader;
  pointer Data_00;
  long lVar9;
  string _msg;
  undefined1 local_81;
  char *Name;
  ResourceType ResType;
  Uint32 NumResources;
  uint local_6c;
  undefined8 local_68;
  ConstQual<unsigned_int> CStack_60;
  Uint32 UStack_5c;
  char *local_58 [2];
  Serializer<(Diligent::SerializerMode)0> Reader;
  
  Clear(this);
  pObj = CI->pData;
  if (pObj == (IDataBlob *)0x0) {
    FormatString<char[23]>(&_msg,(char (*) [23])"pData must not be null");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)
                (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0);
    }
  }
  else {
    if (CI->MakeCopy == true) {
      DataBlobImpl::MakeCopy((DataBlobImpl *)&_msg,pObj);
      RefCntAutoPtr<Diligent::IDataBlob>::operator=
                (&this->m_pArchiveData,
                 (IDataBlob *)CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p));
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)&_msg)
      ;
    }
    else {
      RefCntAutoPtr<Diligent::IDataBlob>::operator=(&this->m_pArchiveData,pObj);
    }
    iVar6 = (*(CI->pData->super_IObject)._vptr_IObject[7])(CI->pData,0);
    iVar7 = (*(CI->pData->super_IObject)._vptr_IObject[5])();
    SerializedData::SerializedData
              ((SerializedData *)&_msg,(void *)CONCAT44(extraout_var,iVar6),
               CONCAT44(extraout_var_00,iVar7));
    Reader.m_Start = (TPointer)_msg._M_string_length;
    Reader.m_End = (TPointer)(_msg.field_2._M_allocated_capacity + _msg._M_string_length);
    Reader.m_Ptr = (TPointer)_msg._M_string_length;
    SerializedData::~SerializedData((SerializedData *)&_msg);
    local_68 = (pointer)0x8de00000a;
    CStack_60._0_1_ = '\b';
    CStack_60._1_1_ = -0x18;
    CStack_60._2_1_ = '\x03';
    CStack_60._3_1_ = '\0';
    UStack_5c._0_1_ = '\0';
    UStack_5c._1_1_ = '\0';
    UStack_5c._2_1_ = '\0';
    UStack_5c._3_1_ = '\0';
    local_58[0] = "9c77d7ae";
    TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                      (&Reader,(ConstQual<unsigned_int> *)&local_68);
    if (TVar3) {
      if ((ConstQual<unsigned_int>)local_68 == 0xde00000a) {
        TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                          (&Reader,(ConstQual<unsigned_int> *)((long)&local_68 + 4));
        if (TVar3) {
          if (local_68._4_4_ == 8) {
            TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                              (&Reader,&CStack_60);
            if (TVar3) {
              TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                                (&Reader,(ConstQual<unsigned_int> *)&UStack_5c);
              if (TVar3) {
                UVar1 = CI->ContentVersion;
                Args_1 = (char (*) [16])
                         (ulong)CONCAT31((int3)(UVar1 >> 8),
                                         UStack_5c != UVar1 && UVar1 != 0xffffffff);
                if (UStack_5c != UVar1 && UVar1 != 0xffffffff) {
                  FormatString<char[34],unsigned_int,char[21],unsigned_int>
                            (&_msg,(Diligent *)"Invalid archive content version: ",
                             (char (*) [34])&UStack_5c,(uint *)". Expected version: ",
                             (char (*) [21])&CI->ContentVersion,in_R9);
                  if (DebugMessageCallback != (undefined *)0x0) {
                    (*(code *)DebugMessageCallback)
                              (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0
                               ,0,0);
                  }
                }
                else {
                  this->m_ContentVersion = UStack_5c;
                  TVar4 = Serializer<(Diligent::SerializerMode)0>::Serialize<char_const*>
                                    (&Reader,local_58);
                  if (TVar4) {
                    NumResources = 0;
                    TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                                      (&Reader,&NumResources);
                    if (TVar3) {
                      for (uVar8 = 0; local_6c = uVar8, uVar8 < NumResources; uVar8 = uVar8 + 1) {
                        Name = (char *)0x0;
                        ResType = Undefined;
                        bVar5 = Serializer<(Diligent::SerializerMode)0>::operator()
                                          (&Reader,&ResType,&Name);
                        if (!bVar5) {
                          local_81 = 0x2e;
                          FormatString<char[46],unsigned_int,char[2],unsigned_int,char>
                                    (&_msg,(Diligent *)
                                           "Failed to read the type and name of resource ",
                                     (char (*) [46])&local_6c,(uint *)0x2d1bee,
                                     (char (*) [2])&NumResources,(uint *)&local_81,
                                     (char *)CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                                      (uint)_msg._M_dataplus._M_p));
                          if (DebugMessageCallback != (undefined *)0x0) {
                            (*(code *)DebugMessageCallback)
                                      (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                                  (uint)_msg._M_dataplus._M_p),0,0,0);
                          }
                          goto LAB_00217da1;
                        }
                        if (Name == (char *)0x0) {
                          FormatString<char[26],char[16]>
                                    (&_msg,(Diligent *)"Debug expression failed:\n",
                                     (char (*) [26])0x2c99aa,Args_1);
                          DebugAssertionFailed
                                    ((Char *)CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                                      (uint)_msg._M_dataplus._M_p),"Deserialize",
                                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                                     ,0xdd);
                          std::__cxx11::string::~string((string *)&_msg);
                        }
                        Args_1 = (char (*) [16])0x0;
                        NamedResourceKey::NamedResourceKey
                                  ((NamedResourceKey *)&_msg,ResType,Name,false);
                        Data = std::__detail::
                               _Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)this,(key_type *)&_msg);
                        HashMapStringKey::Clear((HashMapStringKey *)&_msg._M_string_length);
                        bVar5 = Serializer<(Diligent::SerializerMode)0>::Serialize
                                          (&Reader,&Data->Common);
                        if (bVar5) {
                          lVar9 = 0x20;
                          while (lVar9 != 0x100) {
                            bVar5 = Serializer<(Diligent::SerializerMode)0>::Serialize
                                              (&Reader,(SerializedData *)
                                                       ((long)&(Data->Common).m_pAllocator + lVar9))
                            ;
                            lVar9 = lVar9 + 0x20;
                            if (!bVar5) {
                              FormatString<char[34],char_const*,char[3]>
                                        (&_msg,(Diligent *)"Failed to read data of resource \'",
                                         (char (*) [34])&Name,(char **)"\'.",in_R8);
                              if (DebugMessageCallback != (undefined *)0x0) {
                                (*(code *)DebugMessageCallback)
                                          (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                                      (uint)_msg._M_dataplus._M_p),0,0,0);
                              }
                              goto LAB_00217da1;
                            }
                          }
                        }
                      }
                      lVar9 = 0x38;
                      while( true ) {
                        if (lVar9 == 0xe0) {
                          return true;
                        }
                        _msg._M_dataplus._M_p._0_4_ = 0;
                        TVar3 = Serializer<(Diligent::SerializerMode)0>::Serialize<unsigned_int>
                                          (&Reader,(ConstQual<unsigned_int> *)&_msg);
                        if (!TVar3) break;
                        this_00 = (vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                   *)((long)(this->m_DeviceShaders)._M_elems + lVar9 + -0x38);
                        std::
                        vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                        ::resize(this_00,(ulong)(uint)_msg._M_dataplus._M_p);
                        Data_00 = (this_00->
                                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        pSVar2 = (this_00->
                                 super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                        while (Data_00 != pSVar2) {
                          bVar5 = Serializer<(Diligent::SerializerMode)0>::Serialize
                                            (&Reader,Data_00);
                          Data_00 = Data_00 + 1;
                          if (!bVar5) goto LAB_0021804a;
                        }
                        lVar9 = lVar9 + 0x18;
                      }
LAB_0021804a:
                      FormatString<char[59]>
                                (&_msg,(char (*) [59])
                                       "Failed to read shader data from the device object archive.")
                      ;
                      if (DebugMessageCallback != (undefined *)0x0) {
                        (*(code *)DebugMessageCallback)
                                  (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                              (uint)_msg._M_dataplus._M_p),0,0,0);
                      }
                    }
                    else {
                      FormatString<char[75]>
                                (&_msg,(char (*) [75])
                                       "Failed to read the number of named resources in the device object archive."
                                );
                      if (DebugMessageCallback != (undefined *)0x0) {
                        (*(code *)DebugMessageCallback)
                                  (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,
                                              (uint)_msg._M_dataplus._M_p),0,0,0);
                      }
                    }
                  }
                  else {
                    FormatString<char[25]>(&_msg,(char (*) [25])"Failed to read Git Hash.");
                    if (DebugMessageCallback != (undefined *)0x0) {
                      (*(code *)DebugMessageCallback)
                                (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p)
                                 ,0,0,0);
                    }
                  }
                }
              }
              else {
                FormatString<char[54]>
                          (&_msg,(char (*) [54])
                                 "Failed to read device object archive content version.");
                if (DebugMessageCallback != (undefined *)0x0) {
                  (*(code *)DebugMessageCallback)
                            (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0
                             ,0);
                }
              }
            }
            else {
              FormatString<char[37]>(&_msg,(char (*) [37])"Failed to read Diligent API version.");
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)
                          (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0
                          );
              }
            }
          }
          else {
            Name = (char *)CONCAT44(Name._4_4_,8);
            FormatString<char[44],unsigned_int,char[21],unsigned_int>
                      (&_msg,(Diligent *)"Unsupported device object archive version: ",
                       (char (*) [44])((long)&local_68 + 4),(uint *)". Expected version: ",
                       (char (*) [21])&Name,in_R9);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)
                        (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0);
            }
          }
        }
        else {
          FormatString<char[46]>
                    (&_msg,(char (*) [46])"Failed to read device object archive version.");
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)
                      (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0);
          }
        }
      }
      else {
        FormatString<char[38]>(&_msg,(char (*) [38])"Invalid device object archive header.");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)
                    (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0);
        }
      }
    }
    else {
      FormatString<char[58]>
                (&_msg,(char (*) [58])"Failed to read device object archive header magic number.");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)
                  (2,CONCAT44(_msg._M_dataplus._M_p._4_4_,(uint)_msg._M_dataplus._M_p),0,0,0);
      }
    }
  }
LAB_00217da1:
  std::__cxx11::string::~string((string *)&_msg);
  Clear(this);
  return false;
}

Assistant:

bool DeviceObjectArchive::Deserialize(const CreateInfo& CI) noexcept
{
    Clear();

#define CHECK_ARCHIVE(Expr, ...)            \
    do                                      \
    {                                       \
        if (!(Expr))                        \
        {                                   \
            LOG_ERROR_MESSAGE(__VA_ARGS__); \
            Clear();                        \
            return false;                   \
        }                                   \
    } while (false)

    CHECK_ARCHIVE(CI.pData != nullptr, "pData must not be null");

    m_pArchiveData = CI.MakeCopy ?
        DataBlobImpl::MakeCopy(CI.pData) :
        const_cast<IDataBlob*>(CI.pData); // Need to remove const for AddRef/Release

    Serializer<SerializerMode::Read> Reader{
        SerializedData{
            const_cast<void*>(CI.pData->GetConstDataPtr()),
            CI.pData->GetSize(),
        },
    };
    ArchiveSerializer<SerializerMode::Read> ArchiveReader{Reader};

    // NB: this must match header serialization in DeviceObjectArchive::SerializeHeader
    ArchiveHeader Header;
    ASSERT_SIZEOF64(Header, 24, "Please handle new members here");
    CHECK_ARCHIVE(ArchiveReader.Ser(Header.MagicNumber), "Failed to read device object archive header magic number.");

    CHECK_ARCHIVE(Header.MagicNumber == HeaderMagicNumber, "Invalid device object archive header.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.Version), "Failed to read device object archive version.");

    CHECK_ARCHIVE(Header.Version == ArchiveVersion, "Unsupported device object archive version: ", Header.Version, ". Expected version: ", Uint32{ArchiveVersion});

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.APIVersion), "Failed to read Diligent API version.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.ContentVersion), "Failed to read device object archive content version.");

    CHECK_ARCHIVE(CI.ContentVersion == CreateInfo{}.ContentVersion || Header.ContentVersion == CI.ContentVersion,
                  "Invalid archive content version: ", Header.ContentVersion, ". Expected version: ", CI.ContentVersion);
    m_ContentVersion = Header.ContentVersion;

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.GitHash), "Failed to read Git Hash.");

    Uint32 NumResources = 0;
    CHECK_ARCHIVE(Reader(NumResources), "Failed to read the number of named resources in the device object archive.");

    for (Uint32 res = 0; res < NumResources; ++res)
    {
        const char*  Name    = nullptr;
        ResourceType ResType = ResourceType::Undefined;
        CHECK_ARCHIVE(Reader(ResType, Name), "Failed to read the type and name of resource ", res, "/", NumResources, '.');
        VERIFY_EXPR(Name != nullptr);

        // No need to make the name copy as we keep the source data blob alive.
        constexpr bool MakeNameCopy = false;
        ResourceData&  ResData      = m_NamedResources[NamedResourceKey{ResType, Name, MakeNameCopy}];

        CHECK_ARCHIVE(ArchiveReader.SerializeResourceData(ResData), "Failed to read data of resource '", Name, "'.");
    }

    for (std::vector<SerializedData>& Shaders : m_DeviceShaders)
    {
        CHECK_ARCHIVE(ArchiveReader.SerializeShaders(Shaders), "Failed to read shader data from the device object archive.");
    }
#undef CHECK_ARCHIVE

    return true;
}